

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int * Ssw_SmlCheckOutput(Ssw_Sml_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pObjPo;
  int *piVar3;
  int i;
  
  i = 0;
  pvVar2 = Vec_PtrEntry(p->pAig->vCos,0);
  if ((((uint)*(ulong *)((long)pvVar2 + 8) ^
       *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0) {
    __assert_fail("Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x1e8,"int *Ssw_SmlCheckOutput(Ssw_Sml_t *)");
  }
  do {
    p_00 = p->pAig->vCos;
    if (p_00->nSize <= i) {
      return (int *)0x0;
    }
    pObjPo = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    iVar1 = Ssw_SmlObjIsConstWord(p,(Aig_Obj_t *)((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe));
    i = i + 1;
  } while (iVar1 != 0);
  piVar3 = Ssw_SmlCheckOutputSavePattern(p,pObjPo);
  return piVar3;
}

Assistant:

int * Ssw_SmlCheckOutput( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
    pObj = Aig_ManCo( p->pAig, 0 );
    assert( Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj) );
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        if ( !Ssw_SmlObjIsConstWord( p, Aig_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            return Ssw_SmlCheckOutputSavePattern( p, pObj );
        }
    }
    return NULL;
}